

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIScrollBar::setMin(CGUIScrollBar *this,s32 min)

{
  ulong uVar1;
  
  this->Min = min;
  if (this->Max < min) {
    this->Max = min;
  }
  uVar1 = (ulong)(1e-06 < ABS((float)(this->Max - min)));
  (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->UpButton,uVar1);
  (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->DownButton,uVar1);
  (**(code **)(*(long *)this + 0x168))(this,this->Pos);
  return;
}

Assistant:

void CGUIScrollBar::setMin(s32 min)
{
	Min = min;
	if (Max < Min)
		Max = Min;

	bool enable = core::isnotzero(range());
	UpButton->setEnabled(enable);
	DownButton->setEnabled(enable);
	setPos(Pos);
}